

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O2

void cpptrace::microfmt::detail::do_write<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (string *out,
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     end,format_options *options)

{
  size_type sVar1;
  size_t __n;
  pointer pcVar2;
  ptrdiff_t _Num;
  ulong __n_00;
  pointer __s;
  
  __n_00 = (long)end._M_current - (long)begin._M_current;
  if (options->width <= __n_00) {
    std::__cxx11::string::append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)out,begin,end);
    return;
  }
  sVar1 = out->_M_string_length;
  std::__cxx11::string::resize((ulong)out);
  if (options->align == left) {
    if (end._M_current != begin._M_current) {
      memmove((out->_M_dataplus)._M_p + sVar1,begin._M_current,__n_00);
    }
    pcVar2 = (out->_M_dataplus)._M_p;
    __s = pcVar2 + __n_00 + sVar1;
    pcVar2 = pcVar2 + (out->_M_string_length - (long)__s);
    if (pcVar2 != (pointer)0x0) {
      memset(__s,*(int *)&options->fill,(size_t)pcVar2);
      return;
    }
  }
  else {
    __n = options->width - __n_00;
    if (__n != 0) {
      memset((out->_M_dataplus)._M_p + sVar1,*(int *)&options->fill,__n);
    }
    if (end._M_current != begin._M_current) {
      memmove((out->_M_dataplus)._M_p + (options->width - __n_00) + sVar1,begin._M_current,__n_00);
      return;
    }
  }
  return;
}

Assistant:

void do_write(std::string& out, It begin, It end, const format_options& options) {
            auto size = end - begin;
            if(static_cast<std::size_t>(size) >= options.width) {
                out.append(begin, end);
            } else {
                auto out_size = out.size();
                out.resize(out_size + options.width);
                if(options.align == alignment::left) {
                    std::copy(begin, end, out.begin() + out_size);
                    std::fill(out.begin() + out_size + size, out.end(), options.fill);
                } else {
                    std::fill(out.begin() + out_size, out.begin() + out_size + (options.width - size), options.fill);
                    std::copy(begin, end, out.begin() + out_size + (options.width - size));
                }
            }
        }